

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

int __thiscall NetQuantize::fuse_requantize(NetQuantize *this)

{
  size_type *psVar1;
  int iVar2;
  Layer *pLVar3;
  int *piVar4;
  pointer ppLVar5;
  Layer *pLVar6;
  long *plVar7;
  pointer pMVar8;
  undefined8 uVar9;
  _func_int **pp_Var10;
  void *pvVar11;
  bool bVar12;
  ulong uVar13;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar14;
  ulong uVar15;
  size_t i;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  size_t p;
  ulong local_40;
  
  pvVar14 = (this->super_ModelWriter).layers;
  uVar13 = (long)(pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                 _M_impl.super__Vector_impl_data._M_start >> 3;
  uVar15 = 1;
  for (uVar16 = 0; uVar16 != uVar13; uVar16 = uVar16 + 1) {
    bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar16]->type,"Convolution");
    if ((!bVar12) ||
       (bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                 "ConvolutionDepthWise"), !bVar12)) {
      iVar2 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar16]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar17 = uVar15;
      while ((uVar17 < uVar13 &&
             ((((bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                          "Convolution"), bVar12 &&
                (bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                          "ConvolutionDepthWise"), bVar12)) ||
               (pLVar3 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar17],
               piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (long)*(pointer *)
                      ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl + 8) - (long)piVar4 != 4)) || (*piVar4 != iVar2))))) {
        uVar17 = uVar17 + 1;
      }
      if (uVar13 != uVar17) {
        ppLVar5 = (((this->super_ModelWriter).layers)->
                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        fprintf(_stderr,"fuse_requantize %s %s\n",(ppLVar5[uVar16]->name)._M_dataplus._M_p,
                (ppLVar5[uVar17]->name)._M_dataplus._M_p);
        bVar12 = std::operator==(&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                 "Convolution");
        pvVar14 = (this->super_ModelWriter).layers;
        if (bVar12) {
          bVar12 = std::operator==(&(pvVar14->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                   "Convolution");
          pvVar14 = (this->super_ModelWriter).layers;
          if (bVar12) {
            ppLVar5 = (pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar16];
            if ((*(long *)&pLVar3[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar6 = ppLVar5[uVar17],
               *(long *)&pLVar6[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_00163fef;
            psVar1 = &pLVar3[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            if ((pointer *)&pLVar3[3].support_tensor_storage !=
                (pointer *)
                ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10U
                )) {
              piVar4 = *(int **)&pLVar6[2].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = *(int **)&pLVar3[3].support_reserved_6;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_dataplus._M_p;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_tensor_storage);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)&pLVar3[3].support_reserved_10 = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              pLVar3[3].support_tensor_storage = false;
              pLVar3[3].support_reserved_00 = false;
              pLVar3[3].support_reserved_0 = false;
              pLVar3[3].support_reserved_1 = false;
              pLVar3[3].support_reserved_2 = false;
              pLVar3[3].support_reserved_3 = false;
              pLVar3[3].support_reserved_4 = false;
              pLVar3[3].support_reserved_5 = false;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              pLVar3[3].type._M_string_length = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              uVar9 = pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
              *(pointer *)&pLVar3[3].support_tensor_storage =
                   *(pointer *)
                    ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    0x10);
              pLVar3[3].support_reserved_6 = (bool)(char)uVar9;
              pLVar3[3].support_reserved_7 = (bool)(char)((ulong)uVar9 >> 8);
              pLVar3[3].support_reserved_8 = (bool)(char)((ulong)uVar9 >> 0x10);
              pLVar3[3].support_reserved_9 = (bool)(char)((ulong)uVar9 >> 0x18);
              pLVar3[3].support_reserved_10 = (bool)(char)((ulong)uVar9 >> 0x20);
              pLVar3[3].support_reserved_11 = (bool)(char)((ulong)uVar9 >> 0x28);
              pLVar3[3].support_reserved_12 = (bool)(char)((ulong)uVar9 >> 0x30);
              pLVar3[3].support_reserved_13 = (bool)(char)((ulong)uVar9 >> 0x38);
              pLVar3[3].userdata =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              pLVar3[3].typeindex =
                   *(int *)((long)&pLVar6[2].bottom_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                           + 0x10);
              pLVar3[3].type._M_dataplus._M_p =
                   *(pointer *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        0x10);
              pLVar3[3].type._M_string_length =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              pLVar3[3].type.field_2._M_allocated_capacity = (size_type)pMVar8;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) =
                   *(undefined4 *)&pLVar6[3]._vptr_Layer;
              pLVar3[3].name._M_dataplus._M_p = *(pointer *)&pLVar6[3].one_blob_only;
              pvVar14 = (this->super_ModelWriter).layers;
            }
          }
        }
        bVar12 = std::operator==(&(pvVar14->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                 "Convolution");
        pvVar14 = (this->super_ModelWriter).layers;
        if (bVar12) {
          bVar12 = std::operator==(&(pvVar14->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                   "ConvolutionDepthWise");
          pvVar14 = (this->super_ModelWriter).layers;
          if (bVar12) {
            ppLVar5 = (pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar16];
            if ((*(long *)&pLVar3[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar6 = ppLVar5[uVar17],
               *(pointer *)
                ((long)&pLVar6[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
               (pointer)0x1)) goto LAB_00163fef;
            psVar1 = &pLVar3[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pLVar3[3].support_tensor_storage
                != &pLVar6[2].bottom_shapes) {
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              if (pMVar8 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar8->data = *(int *)&pMVar8->data + 1;
                UNLOCK();
              }
              piVar4 = *(int **)&pLVar3[3].support_reserved_6;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_dataplus._M_p;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_tensor_storage);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)&pLVar3[3].support_reserved_10 = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              pLVar3[3].support_tensor_storage = false;
              pLVar3[3].support_reserved_00 = false;
              pLVar3[3].support_reserved_0 = false;
              pLVar3[3].support_reserved_1 = false;
              pLVar3[3].support_reserved_2 = false;
              pLVar3[3].support_reserved_3 = false;
              pLVar3[3].support_reserved_4 = false;
              pLVar3[3].support_reserved_5 = false;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              pLVar3[3].type._M_string_length = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              uVar9 = pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              pLVar3[3].support_tensor_storage = (bool)(char)uVar9;
              pLVar3[3].support_reserved_00 = (bool)(char)((ulong)uVar9 >> 8);
              pLVar3[3].support_reserved_0 = (bool)(char)((ulong)uVar9 >> 0x10);
              pLVar3[3].support_reserved_1 = (bool)(char)((ulong)uVar9 >> 0x18);
              pLVar3[3].support_reserved_2 = (bool)(char)((ulong)uVar9 >> 0x20);
              pLVar3[3].support_reserved_3 = (bool)(char)((ulong)uVar9 >> 0x28);
              pLVar3[3].support_reserved_4 = (bool)(char)((ulong)uVar9 >> 0x30);
              pLVar3[3].support_reserved_5 = (bool)(char)((ulong)uVar9 >> 0x38);
              *(pointer *)&pLVar3[3].support_reserved_6 = pMVar8;
              pLVar3[3].userdata =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              pLVar3[3].typeindex =
                   *(int *)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data;
              pLVar3[3].type._M_dataplus._M_p =
                   (pointer)*(pointer *)
                             ((long)&pLVar6[2].top_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl + 8);
              pp_Var10 = pLVar6[3]._vptr_Layer;
              pLVar3[3].type._M_string_length =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              pLVar3[3].type.field_2._M_allocated_capacity = (size_type)pp_Var10;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) =
                   *(undefined4 *)&pLVar6[3].one_blob_only;
              pLVar3[3].name._M_dataplus._M_p = *(pointer *)&pLVar6[3].support_tensor_storage;
              pvVar14 = (this->super_ModelWriter).layers;
            }
          }
        }
        bVar12 = std::operator==(&(pvVar14->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                 "ConvolutionDepthWise");
        pvVar14 = (this->super_ModelWriter).layers;
        if (bVar12) {
          bVar12 = std::operator==(&(pvVar14->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                   "Convolution");
          pvVar14 = (this->super_ModelWriter).layers;
          if (bVar12) {
            ppLVar5 = (pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar16];
            if ((*(pointer *)
                  ((long)&pLVar3[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
                 (pointer)0x1) ||
               (pLVar6 = ppLVar5[uVar17],
               *(long *)&pLVar6[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_00163fef;
            piVar4 = (int *)((long)&pLVar3[1].type._M_string_length + 4);
            *piVar4 = *piVar4 + 100;
            if ((pointer *)&pLVar3[3].support_reserved_6 !=
                (pointer *)
                ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10U
                )) {
              piVar4 = *(int **)&pLVar6[2].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = (int *)pLVar3[3].userdata;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_string_length;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_reserved_6);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_string_length = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              *(undefined8 *)&pLVar3[3].field_0x2c = 0;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              pLVar3[3].userdata = (void *)0x0;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              pvVar11 = pLVar6[2].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(pointer *)&pLVar3[3].support_reserved_6 =
                   *(pointer *)
                    ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    0x10);
              pLVar3[3].userdata = pvVar11;
              *(pointer *)&pLVar3[3].typeindex =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              *(undefined4 *)&pLVar3[3].type._M_dataplus._M_p =
                   *(undefined4 *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              pLVar3[3].type._M_string_length =
                   *(size_type *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        0x10);
              pLVar3[3].type.field_2._M_allocated_capacity =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              *(pointer *)((long)&pLVar3[3].type.field_2 + 8) = pMVar8;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p =
                   *(undefined4 *)&pLVar6[3]._vptr_Layer;
              pLVar3[3].name._M_string_length = *(size_type *)&pLVar6[3].one_blob_only;
              pvVar14 = (this->super_ModelWriter).layers;
            }
          }
        }
        bVar12 = std::operator==(&(pvVar14->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar16]->type,
                                 "ConvolutionDepthWise");
        if ((bVar12) &&
           (bVar12 = std::operator==(&(((this->super_ModelWriter).layers)->
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[uVar17]->type,
                                     "ConvolutionDepthWise"), bVar12)) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[uVar16];
          if ((*(pointer *)
                ((long)&pLVar3[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
               (pointer)0x1) &&
             (pLVar6 = ppLVar5[uVar17],
             *(pointer *)
              ((long)&pLVar6[1].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
             (pointer)0x1)) {
            piVar4 = (int *)((long)&pLVar3[1].type._M_string_length + 4);
            *piVar4 = *piVar4 + 100;
            if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pLVar3[3].support_reserved_6 !=
                &pLVar6[2].bottom_shapes) {
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              if (pMVar8 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar8->data = *(int *)&pMVar8->data + 1;
                UNLOCK();
              }
              piVar4 = (int *)pLVar3[3].userdata;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_string_length;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_reserved_6);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_string_length = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              *(undefined8 *)&pLVar3[3].field_0x2c = 0;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              pLVar3[3].userdata = (void *)0x0;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              uVar9 = pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              pLVar3[3].support_reserved_6 = (bool)(char)uVar9;
              pLVar3[3].support_reserved_7 = (bool)(char)((ulong)uVar9 >> 8);
              pLVar3[3].support_reserved_8 = (bool)(char)((ulong)uVar9 >> 0x10);
              pLVar3[3].support_reserved_9 = (bool)(char)((ulong)uVar9 >> 0x18);
              pLVar3[3].support_reserved_10 = (bool)(char)((ulong)uVar9 >> 0x20);
              pLVar3[3].support_reserved_11 = (bool)(char)((ulong)uVar9 >> 0x28);
              pLVar3[3].support_reserved_12 = (bool)(char)((ulong)uVar9 >> 0x30);
              pLVar3[3].support_reserved_13 = (bool)(char)((ulong)uVar9 >> 0x38);
              pLVar3[3].userdata = pMVar8;
              *(pointer *)&pLVar3[3].typeindex =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              *(undefined4 *)&pLVar3[3].type._M_dataplus._M_p =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              pLVar3[3].type._M_string_length =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              pp_Var10 = pLVar6[3]._vptr_Layer;
              pLVar3[3].type.field_2._M_allocated_capacity =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              *(_func_int ***)((long)&pLVar3[3].type.field_2 + 8) = pp_Var10;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p =
                   *(undefined4 *)&pLVar6[3].one_blob_only;
              pLVar3[3].name._M_string_length = *(size_type *)&pLVar6[3].support_tensor_storage;
            }
          }
        }
      }
    }
LAB_00163fef:
    uVar15 = uVar15 + 1;
  }
  local_40 = 2;
  uVar15 = 0;
  do {
    if (uVar15 == uVar13) {
      return 0;
    }
    bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                              _M_impl.super__Vector_impl_data._M_start[uVar15]->type,"Convolution");
    if ((!bVar12) ||
       (bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                 "ConvolutionDepthWise"), !bVar12)) {
      iVar2 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar15]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar16 = local_40;
      while ((uVar16 - 1 < uVar13 &&
             (((bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                          super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                          )._M_impl.super__Vector_impl_data._M_start[uVar16 - 1]->
                                          type,"Split"), bVar12 ||
               (pLVar3 = (((this->super_ModelWriter).layers)->
                         super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                         super__Vector_impl_data._M_start[uVar16 - 1],
               piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
               (long)*(pointer *)
                      ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl + 8) - (long)piVar4 != 4)) || (*piVar4 != iVar2))))) {
        uVar16 = uVar16 + 1;
      }
      if ((1 - uVar13) + uVar16 != 2) {
        pLVar3 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar16 - 1];
        for (uVar17 = 0;
            piVar4 = (pLVar3->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar17 < (ulong)((long)*(pointer *)
                                    ((long)&(pLVar3->tops).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                    8) - (long)piVar4 >> 2); uVar17 = uVar17 + 1) {
          iVar2 = piVar4[uVar17];
          uVar18 = uVar16;
          while ((uVar18 < uVar13 &&
                 (((bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar18]->
                                              type,"Convolution"), bVar12 &&
                   (bVar12 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar18]->
                                              type,"ConvolutionDepthWise"), bVar12)) ||
                  ((pLVar6 = (((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar18],
                   piVar4 = (pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                   (long)*(pointer *)
                          ((long)&(pLVar6->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl + 8) - (long)piVar4 != 4 || (*piVar4 != iVar2))))))) {
            uVar18 = uVar18 + 1;
          }
          if ((2 - uVar13) + uVar18 == 2) goto LAB_001646a7;
          bVar12 = std::operator==(&(((this->super_ModelWriter).layers)->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar18]->type,
                                   "Convolution");
          pLVar6 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar18];
          if (((bVar12) &&
              (*(long *)&pLVar6[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) ||
             ((bVar12 = std::operator==(&pLVar6->type,"ConvolutionDepthWise"), bVar12 &&
              (*(pointer *)
                ((long)&(((this->super_ModelWriter).layers)->
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                        super__Vector_impl_data._M_start[uVar18][1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
               (pointer)0x1)))) goto LAB_001646a7;
        }
        iVar2 = (((this->super_ModelWriter).blobs)->
                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[*piVar4].consumer;
        fprintf(_stderr,"fuse_requantize %s %s\n",
                ((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar15]->name)._M_dataplus._M_p,
                (pLVar3->name)._M_dataplus._M_p);
        bVar12 = std::operator==(&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                 "Convolution");
        pvVar14 = (this->super_ModelWriter).layers;
        if (bVar12) {
          bVar12 = std::operator==(&(pvVar14->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                   "Convolution");
          pvVar14 = (this->super_ModelWriter).layers;
          if (bVar12) {
            ppLVar5 = (pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar15];
            if ((*(long *)&pLVar3[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar6 = ppLVar5[iVar2],
               *(long *)&pLVar6[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_001646a7;
            psVar1 = &pLVar3[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            if ((pointer *)&pLVar3[3].support_tensor_storage !=
                (pointer *)
                ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10U
                )) {
              piVar4 = *(int **)&pLVar6[2].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = *(int **)&pLVar3[3].support_reserved_6;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_dataplus._M_p;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_tensor_storage);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)&pLVar3[3].support_reserved_10 = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              pLVar3[3].support_tensor_storage = false;
              pLVar3[3].support_reserved_00 = false;
              pLVar3[3].support_reserved_0 = false;
              pLVar3[3].support_reserved_1 = false;
              pLVar3[3].support_reserved_2 = false;
              pLVar3[3].support_reserved_3 = false;
              pLVar3[3].support_reserved_4 = false;
              pLVar3[3].support_reserved_5 = false;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              pLVar3[3].type._M_string_length = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              uVar9 = pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
              *(pointer *)&pLVar3[3].support_tensor_storage =
                   *(pointer *)
                    ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    0x10);
              pLVar3[3].support_reserved_6 = (bool)(char)uVar9;
              pLVar3[3].support_reserved_7 = (bool)(char)((ulong)uVar9 >> 8);
              pLVar3[3].support_reserved_8 = (bool)(char)((ulong)uVar9 >> 0x10);
              pLVar3[3].support_reserved_9 = (bool)(char)((ulong)uVar9 >> 0x18);
              pLVar3[3].support_reserved_10 = (bool)(char)((ulong)uVar9 >> 0x20);
              pLVar3[3].support_reserved_11 = (bool)(char)((ulong)uVar9 >> 0x28);
              pLVar3[3].support_reserved_12 = (bool)(char)((ulong)uVar9 >> 0x30);
              pLVar3[3].support_reserved_13 = (bool)(char)((ulong)uVar9 >> 0x38);
              pLVar3[3].userdata =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              pLVar3[3].typeindex =
                   *(int *)((long)&pLVar6[2].bottom_shapes.
                                   super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl
                           + 0x10);
              pLVar3[3].type._M_dataplus._M_p =
                   *(pointer *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        0x10);
              pLVar3[3].type._M_string_length =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              pLVar3[3].type.field_2._M_allocated_capacity = (size_type)pMVar8;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) =
                   *(undefined4 *)&pLVar6[3]._vptr_Layer;
              pLVar3[3].name._M_dataplus._M_p = *(pointer *)&pLVar6[3].one_blob_only;
              pvVar14 = (this->super_ModelWriter).layers;
            }
          }
        }
        bVar12 = std::operator==(&(pvVar14->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                 "Convolution");
        pvVar14 = (this->super_ModelWriter).layers;
        if (bVar12) {
          bVar12 = std::operator==(&(pvVar14->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                   "ConvolutionDepthWise");
          pvVar14 = (this->super_ModelWriter).layers;
          if (bVar12) {
            ppLVar5 = (pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar15];
            if ((*(long *)&pLVar3[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar6 = ppLVar5[iVar2],
               *(pointer *)
                ((long)&pLVar6[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
               (pointer)0x1)) goto LAB_001646a7;
            psVar1 = &pLVar3[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pLVar3[3].support_tensor_storage
                != &pLVar6[2].bottom_shapes) {
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              if (pMVar8 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar8->data = *(int *)&pMVar8->data + 1;
                UNLOCK();
              }
              piVar4 = *(int **)&pLVar3[3].support_reserved_6;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_dataplus._M_p;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_tensor_storage);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_dataplus._M_p = (pointer)0x0;
              *(undefined8 *)&pLVar3[3].support_reserved_10 = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              pLVar3[3].support_tensor_storage = false;
              pLVar3[3].support_reserved_00 = false;
              pLVar3[3].support_reserved_0 = false;
              pLVar3[3].support_reserved_1 = false;
              pLVar3[3].support_reserved_2 = false;
              pLVar3[3].support_reserved_3 = false;
              pLVar3[3].support_reserved_4 = false;
              pLVar3[3].support_reserved_5 = false;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              pLVar3[3].type._M_string_length = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              uVar9 = pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              pLVar3[3].support_tensor_storage = (bool)(char)uVar9;
              pLVar3[3].support_reserved_00 = (bool)(char)((ulong)uVar9 >> 8);
              pLVar3[3].support_reserved_0 = (bool)(char)((ulong)uVar9 >> 0x10);
              pLVar3[3].support_reserved_1 = (bool)(char)((ulong)uVar9 >> 0x18);
              pLVar3[3].support_reserved_2 = (bool)(char)((ulong)uVar9 >> 0x20);
              pLVar3[3].support_reserved_3 = (bool)(char)((ulong)uVar9 >> 0x28);
              pLVar3[3].support_reserved_4 = (bool)(char)((ulong)uVar9 >> 0x30);
              pLVar3[3].support_reserved_5 = (bool)(char)((ulong)uVar9 >> 0x38);
              *(pointer *)&pLVar3[3].support_reserved_6 = pMVar8;
              pLVar3[3].userdata =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              pLVar3[3].typeindex =
                   *(int *)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                            super__Vector_impl_data;
              pLVar3[3].type._M_dataplus._M_p =
                   (pointer)*(pointer *)
                             ((long)&pLVar6[2].top_shapes.
                                     super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                                     _M_impl + 8);
              pp_Var10 = pLVar6[3]._vptr_Layer;
              pLVar3[3].type._M_string_length =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              pLVar3[3].type.field_2._M_allocated_capacity = (size_type)pp_Var10;
              *(undefined4 *)((long)&pLVar3[3].type.field_2 + 8) =
                   *(undefined4 *)&pLVar6[3].one_blob_only;
              pLVar3[3].name._M_dataplus._M_p = *(pointer *)&pLVar6[3].support_tensor_storage;
              pvVar14 = (this->super_ModelWriter).layers;
            }
          }
        }
        bVar12 = std::operator==(&(pvVar14->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                 "ConvolutionDepthWise");
        pvVar14 = (this->super_ModelWriter).layers;
        if (bVar12) {
          bVar12 = std::operator==(&(pvVar14->
                                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                   "Convolution");
          pvVar14 = (this->super_ModelWriter).layers;
          if (bVar12) {
            ppLVar5 = (pvVar14->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            pLVar3 = ppLVar5[uVar15];
            if ((*(pointer *)
                  ((long)&pLVar3[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
                 (pointer)0x1) ||
               (pLVar6 = ppLVar5[iVar2],
               *(long *)&pLVar6[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_001646a7;
            piVar4 = (int *)((long)&pLVar3[1].type._M_string_length + 4);
            *piVar4 = *piVar4 + 100;
            if ((pointer *)&pLVar3[3].support_reserved_6 !=
                (pointer *)
                ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl + 0x10U
                )) {
              piVar4 = *(int **)&pLVar6[2].bottom_shapes.
                                 super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                                 super__Vector_impl_data;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + 1;
                UNLOCK();
              }
              piVar4 = (int *)pLVar3[3].userdata;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_string_length;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_reserved_6);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_string_length = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              *(undefined8 *)&pLVar3[3].field_0x2c = 0;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              pLVar3[3].userdata = (void *)0x0;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              pvVar11 = pLVar6[2].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(pointer *)&pLVar3[3].support_reserved_6 =
                   *(pointer *)
                    ((long)&pLVar6[2].tops.super__Vector_base<int,_std::allocator<int>_>._M_impl +
                    0x10);
              pLVar3[3].userdata = pvVar11;
              *(pointer *)&pLVar3[3].typeindex =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              *(undefined4 *)&pLVar3[3].type._M_dataplus._M_p =
                   *(undefined4 *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              pLVar3[3].type._M_string_length =
                   *(size_type *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].top_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        0x10);
              pLVar3[3].type.field_2._M_allocated_capacity =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              *(pointer *)((long)&pLVar3[3].type.field_2 + 8) = pMVar8;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p =
                   *(undefined4 *)&pLVar6[3]._vptr_Layer;
              pLVar3[3].name._M_string_length = *(size_type *)&pLVar6[3].one_blob_only;
              pvVar14 = (this->super_ModelWriter).layers;
            }
          }
        }
        bVar12 = std::operator==(&(pvVar14->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[uVar15]->type,
                                 "ConvolutionDepthWise");
        if ((bVar12) &&
           (bVar12 = std::operator==(&(((this->super_ModelWriter).layers)->
                                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                      )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                     "ConvolutionDepthWise"), bVar12)) {
          ppLVar5 = (((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pLVar3 = ppLVar5[uVar15];
          if ((*(pointer *)
                ((long)&pLVar3[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
               (pointer)0x1) &&
             (pLVar6 = ppLVar5[iVar2],
             *(pointer *)
              ((long)&pLVar6[1].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
             (pointer)0x1)) {
            piVar4 = (int *)((long)&pLVar3[1].type._M_string_length + 4);
            *piVar4 = *piVar4 + 100;
            if ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pLVar3[3].support_reserved_6 !=
                &pLVar6[2].bottom_shapes) {
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              if (pMVar8 != (pointer)0x0) {
                LOCK();
                *(int *)&pMVar8->data = *(int *)&pMVar8->data + 1;
                UNLOCK();
              }
              piVar4 = (int *)pLVar3[3].userdata;
              if (piVar4 != (int *)0x0) {
                LOCK();
                *piVar4 = *piVar4 + -1;
                UNLOCK();
                if (*piVar4 == 0) {
                  plVar7 = (long *)pLVar3[3].type._M_string_length;
                  if (plVar7 == (long *)0x0) {
                    free(*(void **)&pLVar3[3].support_reserved_6);
                  }
                  else {
                    (**(code **)(*plVar7 + 0x18))();
                  }
                }
              }
              pLVar3[3].name._M_string_length = 0;
              *(undefined8 *)((long)&pLVar3[3].userdata + 4) = 0;
              *(undefined8 *)&pLVar3[3].field_0x2c = 0;
              pLVar3[3].support_reserved_6 = false;
              pLVar3[3].support_reserved_7 = false;
              pLVar3[3].support_reserved_8 = false;
              pLVar3[3].support_reserved_9 = false;
              pLVar3[3].support_reserved_10 = false;
              pLVar3[3].support_reserved_11 = false;
              pLVar3[3].support_reserved_12 = false;
              pLVar3[3].support_reserved_13 = false;
              pLVar3[3].userdata = (void *)0x0;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p = 0;
              pLVar3[3].type.field_2._M_allocated_capacity = 0;
              *(undefined8 *)((long)&pLVar3[3].type.field_2 + 8) = 0;
              uVar9 = pLVar6[2].bottom_shapes.
                      super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                      super__Vector_impl_data._M_start;
              pMVar8 = *(pointer *)
                        ((long)&pLVar6[2].bottom_shapes.
                                super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl +
                        8);
              pLVar3[3].support_reserved_6 = (bool)(char)uVar9;
              pLVar3[3].support_reserved_7 = (bool)(char)((ulong)uVar9 >> 8);
              pLVar3[3].support_reserved_8 = (bool)(char)((ulong)uVar9 >> 0x10);
              pLVar3[3].support_reserved_9 = (bool)(char)((ulong)uVar9 >> 0x18);
              pLVar3[3].support_reserved_10 = (bool)(char)((ulong)uVar9 >> 0x20);
              pLVar3[3].support_reserved_11 = (bool)(char)((ulong)uVar9 >> 0x28);
              pLVar3[3].support_reserved_12 = (bool)(char)((ulong)uVar9 >> 0x30);
              pLVar3[3].support_reserved_13 = (bool)(char)((ulong)uVar9 >> 0x38);
              pLVar3[3].userdata = pMVar8;
              *(pointer *)&pLVar3[3].typeindex =
                   *(pointer *)
                    ((long)&pLVar6[2].bottom_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              *(undefined4 *)&pLVar3[3].type._M_dataplus._M_p =
                   *(undefined4 *)
                    &pLVar6[2].top_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
                     _M_impl.super__Vector_impl_data;
              pLVar3[3].type._M_string_length =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8);
              pp_Var10 = pLVar6[3]._vptr_Layer;
              pLVar3[3].type.field_2._M_allocated_capacity =
                   (size_type)
                   *(pointer *)
                    ((long)&pLVar6[2].top_shapes.
                            super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 0x10
                    );
              *(_func_int ***)((long)&pLVar3[3].type.field_2 + 8) = pp_Var10;
              *(undefined4 *)&pLVar3[3].name._M_dataplus._M_p =
                   *(undefined4 *)&pLVar6[3].one_blob_only;
              pLVar3[3].name._M_string_length = *(size_type *)&pLVar6[3].support_tensor_storage;
            }
          }
        }
      }
    }
LAB_001646a7:
    uVar15 = uVar15 + 1;
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

int NetQuantize::fuse_requantize()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution" && layers[j]->type != "ConvolutionDepthWise")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), layers[j]->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Split - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Split")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Split* split = (ncnn::Split*)layers[j];

        bool all_conv = true;
        for (size_t p = 0; p < split->tops.size(); p++)
        {
            int split_top_blob_index = split->tops[p];

            size_t k = j + 1;
            for (; k < layer_count; k++)
            {
                if (layers[k]->type != "Convolution" && layers[k]->type != "ConvolutionDepthWise")
                    continue;

                if (layers[k]->bottoms.size() != 1)
                    continue;

                if (layers[k]->bottoms[0] == split_top_blob_index)
                    break;
            }

            if (k == layer_count)
            {
                all_conv = false;
                break;
            }

            if (layers[k]->type == "Convolution")
            {
                ncnn::Convolution* convolution = (ncnn::Convolution*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
            if (layers[k]->type == "ConvolutionDepthWise")
            {
                ncnn::ConvolutionDepthWise* convolution = (ncnn::ConvolutionDepthWise*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
        }

        if (!all_conv)
            continue;

        j = blobs[split->tops[0]].consumer;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), split->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    return 0;
}